

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t icu_63::TimeZoneFormat::parseAbuttingAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,OffsetFields minFields,
                  OffsetFields maxFields,UBool fixedHourWidth)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char16_t *pcVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  char16_t cVar14;
  int local_58 [10];
  int32_t digits [6];
  
  uVar2 = pos->index;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar10 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar10 = (int)sVar1 >> 5;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar9 = (text->fUnion).fFields.fArray;
  }
  else {
    pcVar9 = (char16_t *)((long)&text->fUnion + 2);
  }
  iVar6 = (minFields * 2 - (uint)(fixedHourWidth == '\0')) + 2;
  iVar5 = 0;
  for (uVar7 = uVar2; (iVar5 < (int)(maxFields * 2 + 2) && ((int)uVar7 < (int)uVar10));
      uVar7 = uVar7 + 1) {
    cVar14 = L'\xffff';
    if (uVar7 < uVar10) {
      cVar14 = pcVar9[(int)uVar7];
    }
    iVar3 = (ushort)cVar14 - 0x30;
    if (9 < (ushort)(cVar14 + L'￐')) {
      iVar3 = -1;
    }
    if (iVar3 < 0) break;
    local_58[iVar5] = iVar3;
    iVar5 = iVar5 + 1;
  }
  iVar5 = iVar5 - (uint)((byte)iVar5 & fixedHourWidth != '\0');
  if (iVar5 < iVar6) {
    pos->errorIndex = uVar2;
  }
  else {
    iVar3 = local_58[1] + local_58[0] * 10;
    iVar8 = local_58[3] + local_58[2] * 10;
    local_58[2] = local_58[2] + local_58[1] * 10;
    bVar11 = false;
    do {
      iVar4 = 0;
      iVar12 = 0;
      iVar13 = 0;
      switch(iVar5) {
      case 1:
        iVar4 = local_58[0];
        goto LAB_001ff1b2;
      case 2:
        iVar4 = iVar3;
LAB_001ff1b2:
        iVar12 = 0;
        goto LAB_001ff1b5;
      case 3:
        iVar4 = local_58[0];
        iVar12 = local_58[2];
        goto LAB_001ff1b5;
      case 4:
        iVar4 = iVar3;
        iVar12 = iVar8;
LAB_001ff1b5:
        iVar13 = 0;
        break;
      case 5:
        iVar4 = local_58[0];
        iVar12 = local_58[2];
        iVar13 = local_58[4] + local_58[3] * 10;
        break;
      case 6:
        iVar4 = iVar3;
        iVar12 = iVar8;
        iVar13 = local_58[4] * 10 + local_58[5];
      }
      if (((iVar4 < 0x18) && (iVar12 < 0x3c)) && (iVar13 < 0x3c)) {
        iVar4 = iVar4 * 0x3c;
        goto LAB_001ff1ef;
      }
      iVar5 = iVar5 + (fixedHourWidth == '\0' | 0xfffffffe);
      bVar11 = iVar5 < iVar6;
    } while (iVar6 <= iVar5);
    iVar4 = 0;
    iVar12 = 0;
    iVar13 = 0;
LAB_001ff1ef:
    if (!bVar11) {
      pos->index = iVar5 + uVar2;
      return ((iVar12 + iVar4) * 0x3c + iVar13) * 1000;
    }
    pos->errorIndex = uVar2;
  }
  return 0;
}

Assistant:

int32_t
TimeZoneFormat::parseAbuttingAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, OffsetFields minFields, OffsetFields maxFields, UBool fixedHourWidth) {
    int32_t start = pos.getIndex();

    int32_t minDigits = 2 * (minFields + 1) - (fixedHourWidth ? 0 : 1);
    int32_t maxDigits = 2 * (maxFields + 1);

    U_ASSERT(maxDigits <= MAX_OFFSET_DIGITS);

    int32_t digits[MAX_OFFSET_DIGITS] = {};
    int32_t numDigits = 0;
    int32_t idx = start;
    while (numDigits < maxDigits && idx < text.length()) {
        UChar uch = text.charAt(idx);
        int32_t digit = DIGIT_VAL(uch);
        if (digit < 0) {
            break;
        }
        digits[numDigits] = digit;
        numDigits++;
        idx++;
    }

    if (fixedHourWidth && (numDigits & 1)) {
        // Fixed digits, so the number of digits must be even number. Truncating.
        numDigits--;
    }

    if (numDigits < minDigits) {
        pos.setErrorIndex(start);
        return 0;
    }

    int32_t hour = 0, min = 0, sec = 0;
    UBool bParsed = FALSE;
    while (numDigits >= minDigits) {
        switch (numDigits) {
        case 1: //H
            hour = digits[0];
            break;
        case 2: //HH
            hour = digits[0] * 10 + digits[1];
            break;
        case 3: //Hmm
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            break;
        case 4: //HHmm
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            break;
        case 5: //Hmmss
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            sec = digits[3] * 10 + digits[4];
            break;
        case 6: //HHmmss
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            sec = digits[4] * 10 + digits[5];
            break;
        }

        if (hour <= MAX_OFFSET_HOUR && min <= MAX_OFFSET_MINUTE && sec <= MAX_OFFSET_SECOND) {
            // Successfully parsed
            bParsed = true;
            break;
        }

        // Truncating
        numDigits -= (fixedHourWidth ? 2 : 1);
        hour = min = sec = 0;
    }

    if (!bParsed) {
        pos.setErrorIndex(start);
        return 0;
    }
    pos.setIndex(start + numDigits);
    return ((((hour * 60) + min) * 60) + sec) * 1000;
}